

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double dirichlet_pdf(double *x,int n,double *a)

{
  double *pdVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double local_30;
  
  uVar4 = 0;
  uVar3 = 0;
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
  }
  do {
    if (uVar3 == uVar4) {
      dVar5 = r8vec_sum(n,x);
      if (ABS(dVar5 + -1.0) <= 0.0001) {
        dVar5 = r8vec_sum(n,a);
        local_30 = 1.0;
        for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
          dVar6 = tgamma(a[uVar4]);
          local_30 = local_30 * dVar6;
        }
        dVar5 = tgamma(dVar5);
        dVar5 = dVar5 / local_30;
        for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
          dVar6 = pow(x[uVar4],a[uVar4] + -1.0);
          dVar5 = dVar5 * dVar6;
        }
        return dVar5;
      }
      std::operator<<((ostream *)&std::cerr," \n");
      std::operator<<((ostream *)&std::cerr,"DIRICHLET_PDF - Fatal error!\n");
      pcVar2 = "  SUM X(I) =/= 1.\n";
      goto LAB_00199b1b;
    }
    pdVar1 = x + uVar4;
    uVar4 = uVar4 + 1;
  } while (0.0 < *pdVar1);
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"DIRICHLET_PDF - Fatal error!\n");
  pcVar2 = "  X(I) <= 0.\n";
LAB_00199b1b:
  std::operator<<((ostream *)&std::cerr,pcVar2);
  exit(1);
}

Assistant:

double dirichlet_pdf ( double x[], int n, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    DIRICHLET_PDF evaluates the Dirichlet PDF.
//
//  Discussion:
//
//    PDF(N,A;X) = Product ( 1 <= I <= N ) X(I)^( A(I) - 1 )
//      * Gamma ( A_SUM ) / A_PROD
//
//    where
//
//      0 < A(I) for all I;
//      0 <= X(I) for all I;
//      Sum ( 1 <= I <= N ) X(I) = 1;
//      A_SUM = Sum ( 1 <= I <= N ) A(I).
//      A_PROD = Product ( 1 <= I <= N ) Gamma ( A(I) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X(N), the argument of the PDF.  Each X(I) should
//    be greater than 0.0, and the X(I)'s must add up to 1.0.
//
//    Input, int N, the number of components.
//
//    Input, double A(N), the probabilities for each component.
//    Each A(I) should be positive.
//
//    Output, double PDF, the value of the PDF.
//
{
  double a_prod;
  double a_sum;
  int i;
  double pdf;
  double tol = 0.0001;
  double x_sum;

  for ( i = 0; i < n; i++ )
  {
    if ( x[i] <= 0.0 )
    {
      cerr << " \n";
      cerr << "DIRICHLET_PDF - Fatal error!\n";
      cerr << "  X(I) <= 0.\n";
      exit ( 1 );
    }
  }

  x_sum = r8vec_sum ( n, x );

  if ( tol < fabs ( x_sum - 1.0 ) )
  {
    cerr << " \n";
    cerr << "DIRICHLET_PDF - Fatal error!\n";
    cerr << "  SUM X(I) =/= 1.\n";
    exit ( 1 );
  }

  a_sum = r8vec_sum ( n, a );

  a_prod = 1.0;
  for ( i = 0; i < n; i++ )
  {
    a_prod = a_prod * tgamma ( a[i] );
  }

  pdf = tgamma ( a_sum ) / a_prod;

  for ( i = 0; i < n; i++ )
  {
    pdf = pdf * pow ( x[i], a[i] - 1.0 );
  }

  return pdf;
}